

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void DoOneIntegrationTest
               (List<MiniScript::String> *sourceLines,long sourceLineNum,
               List<MiniScript::String> *expectedOutput,long outputLineNum)

{
  Parser *pPVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  String *pSVar5;
  String *s;
  long local_198;
  String local_170;
  long local_160;
  long i_2;
  String local_148;
  String local_138;
  long local_128;
  long i_1;
  String local_110;
  String local_100;
  String local_f0;
  String local_e0;
  String local_d0;
  String local_c0;
  String local_b0;
  long local_a0;
  long i;
  long minLen;
  List<MiniScript::String> local_80;
  undefined1 local_70 [8];
  Interpreter miniscript;
  long outputLineNum_local;
  List<MiniScript::String> *expectedOutput_local;
  long sourceLineNum_local;
  List<MiniScript::String> *sourceLines_local;
  
  miniscript.parser = (Parser *)outputLineNum;
  MiniScript::List<MiniScript::String>::Clear(&testOutput);
  MiniScript::List<MiniScript::String>::List(&local_80,sourceLines);
  MiniScript::Interpreter::Interpreter((Interpreter *)local_70,&local_80);
  MiniScript::List<MiniScript::String>::~List(&local_80);
  miniscript._vptr_Interpreter = (_func_int **)PrintToTestOutput;
  miniscript.implicitOutput = PrintToTestOutput;
  miniscript.standardOutput = PrintToTestOutput;
  MiniScript::Interpreter::RunUntilDone((Interpreter *)local_70,60.0,false);
  MiniScript::Interpreter::~Interpreter((Interpreter *)local_70);
  lVar3 = MiniScript::List<MiniScript::String>::Count(expectedOutput);
  lVar4 = MiniScript::List<MiniScript::String>::Count(&testOutput);
  if (lVar3 < lVar4) {
    local_198 = MiniScript::List<MiniScript::String>::Count(expectedOutput);
  }
  else {
    local_198 = MiniScript::List<MiniScript::String>::Count(&testOutput);
  }
  i = local_198;
  for (local_a0 = 0; local_a0 < i; local_a0 = local_a0 + 1) {
    pSVar5 = MiniScript::List<MiniScript::String>::operator[](&testOutput,local_a0);
    s = MiniScript::List<MiniScript::String>::operator[](expectedOutput,local_a0);
    bVar2 = MiniScript::String::operator!=(pSVar5,s);
    if (bVar2) {
      MiniScript::String::Format
                (&local_100,(long)&((miniscript.parser)->errorContext).ss + local_a0,"%ld");
      MiniScript::operator+((MiniScript *)&local_f0,"TEST FAILED AT LINE ",&local_100);
      MiniScript::String::operator+(&local_e0,(char *)&local_f0);
      MiniScript::List<MiniScript::String>::operator[](expectedOutput,local_a0);
      MiniScript::String::operator+(&local_d0,&local_e0);
      MiniScript::String::operator+(&local_c0,(char *)&local_d0);
      MiniScript::List<MiniScript::String>::operator[](&testOutput,local_a0);
      MiniScript::String::operator+(&local_b0,&local_c0);
      Print(&local_b0,true);
      MiniScript::String::~String(&local_b0);
      MiniScript::String::~String(&local_c0);
      MiniScript::String::~String(&local_d0);
      MiniScript::String::~String(&local_e0);
      MiniScript::String::~String(&local_f0);
      MiniScript::String::~String(&local_100);
    }
  }
  lVar3 = MiniScript::List<MiniScript::String>::Count(expectedOutput);
  lVar4 = MiniScript::List<MiniScript::String>::Count(&testOutput);
  pPVar1 = miniscript.parser;
  if (lVar4 < lVar3) {
    lVar3 = MiniScript::List<MiniScript::String>::Count(&testOutput);
    MiniScript::String::Format((String *)&i_1,(long)&(pPVar1->errorContext).ss + lVar3,"%ld");
    MiniScript::operator+
              ((MiniScript *)&local_110,"TEST FAILED: MISSING OUTPUT AT LINE ",(String *)&i_1);
    Print(&local_110,true);
    MiniScript::String::~String(&local_110);
    MiniScript::String::~String((String *)&i_1);
    for (local_128 = MiniScript::List<MiniScript::String>::Count(&testOutput); lVar3 = local_128,
        lVar4 = MiniScript::List<MiniScript::String>::Count(expectedOutput), lVar3 < lVar4;
        local_128 = local_128 + 1) {
      pSVar5 = MiniScript::List<MiniScript::String>::operator[](expectedOutput,local_128);
      MiniScript::operator+((MiniScript *)&local_138,"  MISSING: ",pSVar5);
      Print(&local_138,true);
      MiniScript::String::~String(&local_138);
    }
  }
  else {
    lVar3 = MiniScript::List<MiniScript::String>::Count(&testOutput);
    lVar4 = MiniScript::List<MiniScript::String>::Count(expectedOutput);
    pPVar1 = miniscript.parser;
    if (lVar4 < lVar3) {
      lVar3 = MiniScript::List<MiniScript::String>::Count(expectedOutput);
      MiniScript::String::Format((String *)&i_2,(long)&(pPVar1->errorContext).ss + lVar3,"%ld");
      MiniScript::operator+
                ((MiniScript *)&local_148,"TEST FAILED: EXTRA OUTPUT AT LINE ",(String *)&i_2);
      Print(&local_148,true);
      MiniScript::String::~String(&local_148);
      MiniScript::String::~String((String *)&i_2);
      for (local_160 = MiniScript::List<MiniScript::String>::Count(expectedOutput);
          lVar3 = local_160, lVar4 = MiniScript::List<MiniScript::String>::Count(&testOutput),
          lVar3 < lVar4; local_160 = local_160 + 1) {
        pSVar5 = MiniScript::List<MiniScript::String>::operator[](&testOutput,local_160);
        MiniScript::operator+((MiniScript *)&local_170,"  EXTRA: ",pSVar5);
        Print(&local_170,true);
        MiniScript::String::~String(&local_170);
      }
    }
  }
  MiniScript::List<MiniScript::String>::Clear(&testOutput);
  return;
}

Assistant:

static void DoOneIntegrationTest(List<String> sourceLines, long sourceLineNum,
				 List<String> expectedOutput, long outputLineNum) {
//	std::cout << "Running test starting at line " << sourceLineNum << std::endl;
	
	testOutput.Clear();
	{
		Interpreter miniscript(sourceLines);
		miniscript.standardOutput = &PrintToTestOutput;
		miniscript.errorOutput = &PrintToTestOutput;
		miniscript.implicitOutput = &PrintToTestOutput;
		miniscript.RunUntilDone(60, false);
	}
	
	long minLen = expectedOutput.Count() < testOutput.Count() ? expectedOutput.Count() : testOutput.Count();
	for (long i = 0; i < minLen; i++) {
		if (testOutput[i] != expectedOutput[i]) {
			Print("TEST FAILED AT LINE " + String::Format(outputLineNum + i)
			+ "\n  EXPECTED: " + expectedOutput[i]
			+ "\n    ACTUAL: " + testOutput[i]);
		}
	}
	if (expectedOutput.Count() > testOutput.Count()) {
		Print("TEST FAILED: MISSING OUTPUT AT LINE " + String::Format(outputLineNum + testOutput.Count()));
		for (long i = testOutput.Count(); i < expectedOutput.Count(); i++) {
			Print("  MISSING: " + expectedOutput[i]);
		}
	} else if (testOutput.Count() > expectedOutput.Count()) {
		Print("TEST FAILED: EXTRA OUTPUT AT LINE " + String::Format(outputLineNum + expectedOutput.Count()));
		for (long i = expectedOutput.Count(); i < testOutput.Count(); i++) {
			Print("  EXTRA: " + testOutput[i]);
		}
	}
	testOutput.Clear();
}